

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

int ZSTD_literalsContribution(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  int iVar1;
  U32 UVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  UVar2 = ZSTD_rawLiteralsCost(literals,litLength,optPtr,optLevel);
  if (optPtr->priceType == zop_dynamic) {
    if (litLength < 0x40) {
      uVar4 = (uint)(byte)ZSTD_LLcode_LL_Code[litLength];
    }
    else {
      uVar4 = 0x1f;
      if (litLength != 0) {
        for (; litLength >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = (uVar4 ^ 0xffffffe0) + 0x33;
    }
    uVar6 = *optPtr->litLengthFreq + 1;
    iVar3 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    if (optLevel == 0) {
      iVar3 = iVar3 << 8;
    }
    else {
      iVar3 = (uVar6 * 0x100 >> ((byte)iVar3 & 0x1f)) + iVar3 * 0x100;
    }
    uVar5 = iVar3 + LL_bits[uVar4] * 0x100;
    uVar6 = optPtr->litLengthFreq[uVar4] + 1;
    uVar4 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    if (optLevel == 0) {
      iVar3 = (uVar4 ^ 0x1f) * 0x100 + -0x1f00;
    }
    else {
      iVar3 = -((uVar6 * 0x100 >> ((byte)uVar4 & 0x1f)) + uVar4 * 0x100);
    }
  }
  else {
    uVar4 = litLength + 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    if (optLevel == 0) {
      iVar3 = iVar1 << 8;
      goto LAB_00137b81;
    }
    iVar3 = iVar1 << 8;
    uVar5 = uVar4 * 0x100 >> ((byte)iVar1 & 0x1f);
  }
  iVar3 = uVar5 + iVar3;
LAB_00137b81:
  return iVar3 + UVar2;
}

Assistant:

static int ZSTD_literalsContribution(const BYTE* const literals, U32 const litLength,
                                     const optState_t* const optPtr,
                                     int optLevel)
{
    int const contribution = ZSTD_rawLiteralsCost(literals, litLength, optPtr, optLevel)
                           + ZSTD_litLengthContribution(litLength, optPtr, optLevel);
    return contribution;
}